

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.cpp
# Opt level: O2

bool convert<float,short>(TWaveformT<float> *src,TWaveformT<short> *dst)

{
  pointer pfVar1;
  pointer pfVar2;
  pointer psVar3;
  long lVar4;
  double dVar5;
  double dVar6;
  
  std::vector<short,_std::allocator<short>_>::resize
            (dst,(long)(src->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                       super__Vector_impl_data._M_finish -
                 (long)(src->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                       super__Vector_impl_data._M_start >> 2);
  dVar5 = calcAbsMax<float>(src);
  pfVar1 = (src->super__Vector_base<float,_std::allocator<float>_>)._M_impl.super__Vector_impl_data.
           _M_start;
  pfVar2 = (src->super__Vector_base<float,_std::allocator<float>_>)._M_impl.super__Vector_impl_data.
           _M_finish;
  psVar3 = (dst->super__Vector_base<short,_std::allocator<short>_>)._M_impl.super__Vector_impl_data.
           _M_start;
  for (lVar4 = 0; lVar4 < (int)((ulong)((long)pfVar2 - (long)pfVar1) >> 2); lVar4 = lVar4 + 1) {
    dVar6 = round((double)pfVar1[lVar4] *
                  (double)(~-(ulong)(dVar5 != 0.0) & 0x3ff0000000000000 |
                          (ulong)(1.0 / dVar5) & -(ulong)(dVar5 != 0.0)) * 32767.0);
    psVar3[lVar4] = (short)(int)dVar6;
  }
  return true;
}

Assistant:

bool convert(const TWaveformT<TSampleSrc> & src, TWaveformT<TSampleDst> & dst) {
    static_assert(std::is_same<TSampleSrc, TSampleDst>::value == false, "Required different sample types");

    static_assert(std::is_same<TSampleSrc, TSampleF>::value, "Source sample type not supported");
    static_assert(std::is_same<TSampleDst, TSampleI16>::value, "Destination sample type not supported");

    dst.resize(src.size());

    double amax = calcAbsMax(src);
    double iamax = amax != 0.0 ? 1.0/amax : 1.0;
    for (auto i = 0; i < (int) src.size(); ++i) dst[i] = std::round(std::numeric_limits<TSampleDst>::max()*(src[i]*iamax));

    return true;
}